

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_SpaceUsed_Test::
~UnknownFieldSetTest_SpaceUsed_Test(UnknownFieldSetTest_SpaceUsed_Test *this)

{
  UnknownFieldSetTest_SpaceUsed_Test *this_local;
  
  ~UnknownFieldSetTest_SpaceUsed_Test(this);
  operator_delete(this,0x398);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, SpaceUsed) {
  // Keep shadow vectors to avoid making assumptions about its capacity growth.
  // We imitate the push back calls here to determine the expected capacity.
  RepeatedField<UnknownField> shadow_vector, shadow_vector_group;
  unittest::TestEmptyMessage empty_message;

  // Make sure an unknown field set has zero space used until a field is
  // actually added.
  const size_t base = empty_message.SpaceUsedLong();
  std::string* str = nullptr;
  UnknownFieldSet* group = nullptr;
  const auto total = [&] {
    size_t result = base;
    result += shadow_vector.SpaceUsedExcludingSelfLong();
    result += shadow_vector_group.SpaceUsedExcludingSelfLong();
    if (str != nullptr) {
      result += sizeof(std::string) +
                internal::StringSpaceUsedExcludingSelfLong(*str);
    }
    if (group != nullptr) {
      result += sizeof(UnknownFieldSet);
    }
    return result;
  };

  UnknownFieldSet* unknown_fields = empty_message.mutable_unknown_fields();
  EXPECT_EQ(total(), empty_message.SpaceUsedLong());

  // Make sure each thing we add to the set increases the SpaceUsedLong().
  unknown_fields->AddVarint(1, 0);
  shadow_vector.Add();
  EXPECT_EQ(total(), empty_message.SpaceUsedLong()) << "Var";

  str =
      internal::UnknownFieldSetTestPeer::AddLengthDelimited(*unknown_fields, 1);
  shadow_vector.Add();
  EXPECT_EQ(total(), empty_message.SpaceUsedLong()) << "Str";

  str->assign(sizeof(std::string) + 1, 'x');
  EXPECT_EQ(total(), empty_message.SpaceUsedLong()) << "Str2";

  group = unknown_fields->AddGroup(1);
  shadow_vector.Add();
  EXPECT_EQ(total(), empty_message.SpaceUsedLong()) << "Group";

  group->AddVarint(1, 0);
  shadow_vector_group.Add();
  EXPECT_EQ(total(), empty_message.SpaceUsedLong()) << "Group2";

  unknown_fields->AddVarint(1, 0);
  shadow_vector.Add();
  EXPECT_EQ(total(), empty_message.SpaceUsedLong()) << "Var2";
}